

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

void htmlAttrDumpOutput(xmlOutputBufferPtr buf,xmlDocPtr doc,xmlAttrPtr cur)

{
  int iVar1;
  byte *string;
  xmlChar *string_00;
  bool bVar2;
  byte *local_38;
  xmlChar *tmp;
  xmlChar *escaped;
  xmlChar *value;
  xmlAttrPtr cur_local;
  xmlDocPtr doc_local;
  xmlOutputBufferPtr buf_local;
  
  if (cur != (xmlAttrPtr)0x0) {
    xmlOutputBufferWriteString(buf," ");
    if ((cur->ns != (xmlNs *)0x0) && (cur->ns->prefix != (xmlChar *)0x0)) {
      xmlOutputBufferWriteString(buf,(char *)cur->ns->prefix);
      xmlOutputBufferWriteString(buf,":");
    }
    xmlOutputBufferWriteString(buf,(char *)cur->name);
    if ((cur->children != (_xmlNode *)0x0) && (iVar1 = htmlIsBooleanAttr(cur->name), iVar1 == 0)) {
      string = xmlNodeListGetString(doc,cur->children,0);
      if (string == (byte *)0x0) {
        buf->error = 2;
      }
      else {
        xmlOutputBufferWriteString(buf,"=");
        if ((((cur->ns == (xmlNs *)0x0) && (cur->parent != (_xmlNode *)0x0)) &&
            (cur->parent->ns == (xmlNs *)0x0)) &&
           (((iVar1 = xmlStrcasecmp(cur->name,"href"), local_38 = string, iVar1 == 0 ||
             (iVar1 = xmlStrcasecmp(cur->name,(xmlChar *)"action"), iVar1 == 0)) ||
            ((iVar1 = xmlStrcasecmp(cur->name,(xmlChar *)"src"), iVar1 == 0 ||
             ((iVar1 = xmlStrcasecmp(cur->name,"name"), iVar1 == 0 &&
              (iVar1 = xmlStrcasecmp(cur->parent->name,"a"), iVar1 == 0)))))))) {
          while( true ) {
            bVar2 = true;
            if ((*local_38 != 0x20) && ((*local_38 < 9 || (bVar2 = true, 10 < *local_38)))) {
              bVar2 = *local_38 == 0xd;
            }
            if (!bVar2) break;
            local_38 = local_38 + 1;
          }
          string_00 = xmlURIEscapeStr(local_38,(xmlChar *)"\"#$%&+,/:;<=>?@[\\]^`{|}");
          if (string_00 == (xmlChar *)0x0) {
            buf->error = 2;
          }
          else {
            xmlOutputBufferWriteQuotedString(buf,string_00);
            (*xmlFree)(string_00);
          }
        }
        else {
          xmlOutputBufferWriteQuotedString(buf,string);
        }
        (*xmlFree)(string);
      }
    }
  }
  return;
}

Assistant:

static void
htmlAttrDumpOutput(xmlOutputBufferPtr buf, xmlDocPtr doc, xmlAttrPtr cur) {
    xmlChar *value;

    /*
     * The html output method should not escape a & character
     * occurring in an attribute value immediately followed by
     * a { character (see Section B.7.1 of the HTML 4.0 Recommendation).
     * This is implemented in xmlEncodeEntitiesReentrant
     */

    if (cur == NULL) {
	return;
    }
    xmlOutputBufferWriteString(buf, " ");
    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
        xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
	xmlOutputBufferWriteString(buf, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *)cur->name);
    if ((cur->children != NULL) && (!htmlIsBooleanAttr(cur->name))) {
	value = xmlNodeListGetString(doc, cur->children, 0);
	if (value) {
	    xmlOutputBufferWriteString(buf, "=");
	    if ((cur->ns == NULL) && (cur->parent != NULL) &&
		(cur->parent->ns == NULL) &&
		((!xmlStrcasecmp(cur->name, BAD_CAST "href")) ||
	         (!xmlStrcasecmp(cur->name, BAD_CAST "action")) ||
		 (!xmlStrcasecmp(cur->name, BAD_CAST "src")) ||
		 ((!xmlStrcasecmp(cur->name, BAD_CAST "name")) &&
		  (!xmlStrcasecmp(cur->parent->name, BAD_CAST "a"))))) {
		xmlChar *escaped;
		xmlChar *tmp = value;

		while (IS_BLANK_CH(*tmp)) tmp++;

		/*
                 * Angle brackets are technically illegal in URIs, but they're
                 * used in server side includes, for example. Curly brackets
                 * are illegal as well and often used in templates.
                 * Don't escape non-whitespace, printable ASCII chars for
                 * improved interoperability. Only escape space, control
                 * and non-ASCII chars.
		 */
		escaped = xmlURIEscapeStr(tmp,
                        BAD_CAST "\"#$%&+,/:;<=>?@[\\]^`{|}");
		if (escaped != NULL) {
		    xmlOutputBufferWriteQuotedString(buf, escaped);
		    xmlFree(escaped);
		} else {
                    buf->error = XML_ERR_NO_MEMORY;
		}
	    } else {
		xmlOutputBufferWriteQuotedString(buf, value);
	    }
	    xmlFree(value);
	} else  {
            buf->error = XML_ERR_NO_MEMORY;
	}
    }
}